

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O1

singlecomplex c_sgn(singlecomplex *z)

{
  double dVar1;
  singlecomplex sVar2;
  float fVar3;
  
  dVar1 = c_abs(z);
  fVar3 = (float)dVar1;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sVar2.r = z->r / fVar3;
    sVar2.i = z->i / fVar3;
  }
  else {
    sVar2.r = 1.0;
    sVar2.i = 0.0;
  }
  return sVar2;
}

Assistant:

singlecomplex c_sgn(singlecomplex *z)
{
    register float t = c_abs(z);
    register singlecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}